

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O0

bool __thiscall
parser::BracketNotationParser<label::StringLabel>::validate_input
          (BracketNotationParser<label::StringLabel> *this,string *tree_string)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  int bracket_pair_counter;
  int bracket_diff_counter;
  string *tree_string_local;
  BracketNotationParser<label::StringLabel> *this_local;
  
  it._M_current._4_4_ = 0;
  it._M_current._0_4_ = 0;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_38._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    if (*pcVar3 == this->kEscapeChar) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_30);
    }
    else {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      cVar1 = *pcVar3;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->kLeftBracket);
      if (cVar1 == *pcVar4) {
        it._M_current._4_4_ = it._M_current._4_4_ + 1;
        it._M_current._0_4_ = (int)it._M_current + 1;
      }
      else {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_30);
        cVar1 = *pcVar3;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->kRightBracket);
        if (cVar1 == *pcVar4) {
          it._M_current._4_4_ = it._M_current._4_4_ + -1;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  if ((it._M_current._4_4_ == 0) && ((int)it._M_current != 0)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BracketNotationParser<Label>::validate_input(const std::string& tree_string) const {
  int bracket_diff_counter = 0; // Counts difference between the numbers of left and right brackets.
  int bracket_pair_counter = 0; // Counts number of bracket pairs - number of nodes assuming correct nesting.
  // Loop over all characters.
  for(auto it = tree_string.begin(); it != tree_string.end(); ++it) {
    if (*it == kEscapeChar) { // Skip next character if kEscapeChar is found.
      ++it;
    } else if (*it == kLeftBracket[0]) { // Increase bracket_counter when kLeftBracket found.
      bracket_diff_counter++;
      bracket_pair_counter++;
    } else if (*it == kRightBracket[0]) { // Decrease bracket_counter when kRightBracket found.
      bracket_diff_counter--;
    }
  }
  if (bracket_diff_counter != 0 || bracket_pair_counter == 0) {
    return false;
  }
  return true;
}